

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<bool>::RemoveLast(RepeatedField<bool> *this)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Nonnull<const_char_*> pcVar4;
  bool is_soo;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (iVar2 < 1) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar2,0,"old_size > 0");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    is_soo = (uVar1 & 4) == 0;
    elements(this,is_soo);
    iVar3 = protobuf::internal::SooRep::size(&this->soo_rep_,is_soo);
    if ((iVar3 != iVar2 + -1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      protobuf::internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,iVar2 + -1);
    return;
  }
  RemoveLast();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}